

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CField *stm)

{
  CType *pCVar1;
  iterator iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string errorMessage;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  undefined1 local_58 [32];
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: field\n",0x13);
  if (((stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
       super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
       super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0) ||
     (pCVar1 = (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
               super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
               super__Head_base<0UL,_CType_*,_false>._M_head_impl, pCVar1 == (CType *)0x0)) {
    CError::CError((CError *)local_68,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_68);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58;
LAB_0012163b:
    local_60._M_p = *(pointer *)(paVar3->_M_local_buf + -0x10);
  }
  else {
    if (pCVar1->isPrimitive == false) {
      iVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,
                     (key_type *)
                     ((long)(pCVar1->name)._M_t.
                            super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        CType::toString_abi_cxx11_
                  ((string *)local_68,
                   (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                   super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                   super__Head_base<0UL,_CType_*,_false>._M_head_impl);
        CError::GetUndeclaredErrorMessage(&local_38,(string *)local_68);
        if (local_68 != (undefined1  [8])local_58) {
          operator_delete((void *)local_68);
        }
        CError::CError((CError *)local_68,&local_38,
                       (PositionInfo *)
                       ((long)&(((stm->type)._M_t.
                                 super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                                 super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                                 super__Head_base<0UL,_CType_*,_false>._M_head_impl)->super_IWrapper
                               ).super_PositionedNode + 8));
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_68);
        if (local_68 != (undefined1  [8])local_58) {
          operator_delete((void *)local_68);
        }
        paVar3 = &local_38.field_2;
        goto LAB_0012163b;
      }
    }
    TypeInfo::TypeInfo((TypeInfo *)local_68,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_68[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_68._1_3_;
    (this->lastCalculatedType).type = local_68._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_60);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_58 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != paVar3) {
    operator_delete(local_60._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CField &stm ) 
{
	std::cout << "typechecker: field\n";
    if( stm.id && stm.type ) {
        bool isVisibleType = checkTypeExisting(*stm.type);
        if( !isVisibleType ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.type->toString() );
            errors.push_back( CError( errorMessage, stm.type->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}